

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::net::Socket_testFailOpen_Test::TestBody(Socket_testFailOpen_Test *this)

{
  char cVar1;
  AssertHelper aAStack_28 [8];
  Message local_20 [8];
  Socket socket;
  
  Socket::Socket(&socket);
  cVar1 = testing::internal::AlwaysTrue();
  if (cVar1 != '\0') {
    Socket::open(&socket,(char *)0xfffffffffffffffb,-10);
  }
  testing::Message::Message(local_20);
  testing::internal::AssertHelper::AssertHelper
            (aAStack_28,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/SocketTest.cpp"
             ,0x1e,
             "Expected: socket.open(-5, -10) throws an exception of type std::system_error.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(aAStack_28,local_20);
  testing::internal::AssertHelper::~AssertHelper(aAStack_28);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_20);
  Socket::~Socket(&socket);
  return;
}

Assistant:

TEST(Socket, testFailOpen)
{
    Socket socket;
    ASSERT_THROW(socket.open(-5, -10), std::system_error);
}